

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O1

void __thiscall
duckdb::AggregateFunction::AggregateFunction(AggregateFunction *this,AggregateFunction *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  FunctionNullHandling FVar2;
  FunctionErrors FVar3;
  FunctionCollationHandling FVar4;
  AggregateDistinctDependent AVar5;
  long lVar6;
  aggregate_size_t *pp_Var7;
  aggregate_size_t *pp_Var8;
  byte bVar9;
  
  bVar9 = 0;
  SimpleFunction::SimpleFunction((SimpleFunction *)this,(SimpleFunction *)param_1);
  (this->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::LogicalType
            (&(this->super_BaseScalarFunction).return_type,
             &(param_1->super_BaseScalarFunction).return_type);
  FVar2 = (param_1->super_BaseScalarFunction).null_handling;
  FVar3 = (param_1->super_BaseScalarFunction).errors;
  FVar4 = (param_1->super_BaseScalarFunction).collation_handling;
  (this->super_BaseScalarFunction).stability = (param_1->super_BaseScalarFunction).stability;
  (this->super_BaseScalarFunction).null_handling = FVar2;
  (this->super_BaseScalarFunction).errors = FVar3;
  (this->super_BaseScalarFunction).collation_handling = FVar4;
  (this->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  pp_Var7 = &param_1->state_size;
  pp_Var8 = &this->state_size;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pp_Var8 = *pp_Var7;
    pp_Var7 = pp_Var7 + (ulong)bVar9 * -2 + 1;
    pp_Var8 = pp_Var8 + (ulong)bVar9 * -2 + 1;
  }
  AVar5 = param_1->distinct_dependent;
  this->order_dependent = param_1->order_dependent;
  this->distinct_dependent = AVar5;
  (this->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->function_info).internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (param_1->function_info).internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

AggregateFunction(const string &name, const vector<LogicalType> &arguments, const LogicalType &return_type,
	                  aggregate_size_t state_size, aggregate_initialize_t initialize, aggregate_update_t update,
	                  aggregate_combine_t combine, aggregate_finalize_t finalize,
	                  FunctionNullHandling null_handling = FunctionNullHandling::DEFAULT_NULL_HANDLING,
	                  aggregate_simple_update_t simple_update = nullptr, bind_aggregate_function_t bind = nullptr,
	                  aggregate_destructor_t destructor = nullptr, aggregate_statistics_t statistics = nullptr,
	                  aggregate_window_t window = nullptr, aggregate_serialize_t serialize = nullptr,
	                  aggregate_deserialize_t deserialize = nullptr)
	    : BaseScalarFunction(name, arguments, return_type, FunctionStability::CONSISTENT,
	                         LogicalType(LogicalTypeId::INVALID), null_handling),
	      state_size(state_size), initialize(initialize), update(update), combine(combine), finalize(finalize),
	      simple_update(simple_update), window(window), bind(bind), destructor(destructor), statistics(statistics),
	      serialize(serialize), deserialize(deserialize), order_dependent(AggregateOrderDependent::ORDER_DEPENDENT),
	      distinct_dependent(AggregateDistinctDependent::DISTINCT_DEPENDENT) {
	}